

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void cfd::core::ConfidentialNonce::CheckVersion(uint8_t version)

{
  CfdException *this;
  uint8_t version_local;
  allocator local_39;
  undefined1 local_38 [32];
  
  if (version < 4) {
    return;
  }
  local_38._0_8_ = "cfdcore_elements_transaction.cpp";
  local_38._8_4_ = 0x145;
  local_38._16_8_ = "CheckVersion";
  version_local = version;
  logger::warn<unsigned_char&>
            ((CfdSourceLocation *)local_38,"Nonce version Invalid. version={}.",&version_local);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"Nonce version Invalid.",&local_39);
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_38);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialNonce::CheckVersion(uint8_t version) {
  if ((version != 0) && (version != 1) && (version != 2) && (version != 3)) {
    warn(CFD_LOG_SOURCE, "Nonce version Invalid. version={}.", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Nonce version Invalid.");
  }
}